

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

void __thiscall
wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer::
visitLocalSet(wasm::LocalSet__(void *this,LocalSet *curr)

{
  Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *this_00;
  Module *module;
  Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *this_01;
  LocalSet *this_02;
  Expression *pEVar1;
  bool bVar2;
  Expression **ppEVar3;
  Drop *this_03;
  Drop *expression;
  Expression *pEVar4;
  Expression *local_48;
  Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *local_40;
  LocalSet *local_38;
  
  module = *(Module **)((long)this + 0xd0);
  pEVar1 = curr->value;
  local_40 = (Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)this;
  local_38 = curr;
  do {
    pEVar4 = pEVar1;
    local_48 = pEVar4;
    ppEVar3 = Properties::getImmediateFallthroughPtr
                        (&local_48,(PassOptions *)((long)this + 0xf0),module,AllowTeeBrIf);
    this_02 = local_38;
    this_01 = local_40;
    pEVar1 = *ppEVar3;
  } while (*ppEVar3 != pEVar4);
  this_00 = local_40 + 2;
  if (pEVar4->_id == LocalGetId) {
    bVar2 = EquivalentSets::check((EquivalentSets *)this_00,local_38->index,*(Index *)(pEVar4 + 1));
    if (bVar2) {
      if (*(char *)&this_01[1].stack.fixed._M_elems[0].func == '\x01') {
        bVar2 = LocalSet::isTee(this_02);
        expression = (Drop *)this_02->value;
        if (bVar2) {
          if ((expression->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type
              .id != (this_02->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                     type.id) {
            *(undefined1 *)((long)&this_01[1].currModule + 1) = 1;
          }
        }
        else {
          this_03 = (Drop *)MixedArena::allocSpace(&module->allocator,0x18,8);
          (this_03->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
               DropId;
          (this_03->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0
          ;
          this_03->value = (Expression *)expression;
          Drop::finalize(this_03);
          expression = this_03;
        }
        Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::replaceCurrent
                  (this_01,(Expression *)expression);
        *(undefined1 *)&this_01[1].currModule = 1;
      }
    }
    else {
      EquivalentSets::reset((EquivalentSets *)this_00,this_02->index);
      EquivalentSets::add((EquivalentSets *)this_00,this_02->index,*(Index *)(pEVar4 + 1));
    }
  }
  else {
    EquivalentSets::reset((EquivalentSets *)this_00,local_38->index);
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
        auto* module = this->getModule();

        // Remove trivial copies, even through a tee
        auto* value =
          Properties::getFallthrough(curr->value, passOptions, *module);
        if (auto* get = value->template dynCast<LocalGet>()) {
          if (equivalences.check(curr->index, get->index)) {
            // This is an unnecessary copy!
            if (removeEquivalentSets) {
              if (curr->isTee()) {
                if (curr->value->type != curr->type) {
                  refinalize = true;
                }
                this->replaceCurrent(curr->value);
              } else {
                this->replaceCurrent(Builder(*module).makeDrop(curr->value));
              }
              anotherCycle = true;
            }
            // Nothing more to do, ignore the copy.
            return;
          } else {
            // There is a new equivalence now. Remove all the old ones, and add
            // the new one.
            equivalences.reset(curr->index);
            equivalences.add(curr->index, get->index);
            return;
          }
        }
        // A new value of some kind is assigned here, and it's not something we
        // could handle earlier, so remove all the old equivalent ones.
        equivalences.reset(curr->index);
      }